

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O0

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  int iVar1;
  size_t n;
  undefined4 extraout_var;
  long lVar2;
  undefined1 *puVar3;
  undefined4 in_register_00000084;
  size_t encoded_1;
  size_t encoded;
  size_t todo;
  size_t total;
  size_t in_len_local;
  uint8_t *in_local;
  int *out_len_local;
  uint8_t *out_local;
  EVP_ENCODE_CTX *ctx_local;
  undefined4 extraout_var_00;
  
  total = CONCAT44(in_register_00000084,inl);
  todo = 0;
  *outl = 0;
  if (total != 0) {
    if (0x2f < (uint)ctx->num) {
      __assert_fail("ctx->data_used < sizeof(ctx->data)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/base64/base64.cc"
                    ,0x65,
                    "void EVP_EncodeUpdate(EVP_ENCODE_CTX *, uint8_t *, int *, const uint8_t *, size_t)"
                   );
    }
    if (total < 0x30 - (ulong)(uint)ctx->num) {
      OPENSSL_memcpy(ctx->enc_data + ((ulong)(uint)ctx->num - 4),in,total);
      ctx->num = inl + ctx->num;
    }
    else {
      in_len_local = (size_t)in;
      out_len_local = (int *)out;
      if (ctx->num != 0) {
        n = 0x30 - (ulong)(uint)ctx->num;
        OPENSSL_memcpy(ctx->enc_data + ((ulong)(uint)ctx->num - 4),in,n);
        in_len_local = (size_t)(in + n);
        total = total - n;
        iVar1 = EVP_EncodeBlock(out,(uchar *)&ctx->length,0x30);
        ctx->num = 0;
        out_len_local = (int *)(out + CONCAT44(extraout_var,iVar1) + 1);
        out[CONCAT44(extraout_var,iVar1)] = '\n';
        *(uchar *)out_len_local = '\0';
        todo = CONCAT44(extraout_var,iVar1) + 1;
      }
      while (0x2f < total) {
        iVar1 = EVP_EncodeBlock((uchar *)out_len_local,(uchar *)in_len_local,0x30);
        lVar2 = CONCAT44(extraout_var_00,iVar1);
        in_len_local = in_len_local + 0x30;
        total = total - 0x30;
        puVar3 = (undefined1 *)(lVar2 + (long)out_len_local);
        out_len_local = (int *)(puVar3 + 1);
        *puVar3 = 10;
        *(undefined1 *)out_len_local = 0;
        if (todo + lVar2 + 1 < todo) {
          *outl = 0;
          return;
        }
        todo = lVar2 + 1 + todo;
      }
      if (total != 0) {
        OPENSSL_memcpy(&ctx->length,(void *)in_len_local,total);
      }
      ctx->num = (int)total;
      if (0x7fffffff < todo) {
        todo = 0;
      }
      *outl = (int)todo;
    }
  }
  return;
}

Assistant:

void EVP_EncodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                      const uint8_t *in, size_t in_len) {
  size_t total = 0;

  *out_len = 0;
  if (in_len == 0) {
    return;
  }

  assert(ctx->data_used < sizeof(ctx->data));

  if (sizeof(ctx->data) - ctx->data_used > in_len) {
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, in_len);
    ctx->data_used += (unsigned)in_len;
    return;
  }

  if (ctx->data_used != 0) {
    const size_t todo = sizeof(ctx->data) - ctx->data_used;
    OPENSSL_memcpy(&ctx->data[ctx->data_used], in, todo);
    in += todo;
    in_len -= todo;

    size_t encoded = EVP_EncodeBlock(out, ctx->data, sizeof(ctx->data));
    ctx->data_used = 0;

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    total = encoded + 1;
  }

  while (in_len >= sizeof(ctx->data)) {
    size_t encoded = EVP_EncodeBlock(out, in, sizeof(ctx->data));
    in += sizeof(ctx->data);
    in_len -= sizeof(ctx->data);

    out += encoded;
    *(out++) = '\n';
    *out = '\0';

    if (total + encoded + 1 < total) {
      *out_len = 0;
      return;
    }

    total += encoded + 1;
  }

  if (in_len != 0) {
    OPENSSL_memcpy(ctx->data, in, in_len);
  }

  ctx->data_used = (unsigned)in_len;

  if (total > INT_MAX) {
    // We cannot signal an error, but we can at least avoid making *out_len
    // negative.
    total = 0;
  }
  *out_len = (int)total;
}